

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  convert_32s_PXCX p_Var3;
  long lVar4;
  ulong uVar5;
  OPJ_BYTE *pOVar6;
  OPJ_INT32 local_a4;
  convert_32sXXx_C1R local_98;
  convert_32sXXx_C1R cvt32sToTif;
  convert_32s_PXCX cvtPxToCx;
  OPJ_INT32 *planes [4];
  OPJ_INT32 *buffer32s;
  OPJ_SIZE_T rowStride;
  OPJ_UINT32 numcomps;
  OPJ_UINT32 i;
  tsize_t strip_size;
  tdata_t buf;
  TIFF *tif;
  int tiPhoto;
  int sgnd;
  int adjust;
  int bps;
  int height;
  int width;
  char *outfile_local;
  opj_image_t *image_local;
  
  planes[3] = (OPJ_INT32 *)0x0;
  local_98 = (convert_32sXXx_C1R)0x0;
  sgnd = image->comps->prec;
  cvtPxToCx = (convert_32s_PXCX)image->comps->data;
  rowStride._0_4_ = image->numcomps;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if ((uint)rowStride < 4) {
      fprintf(_stderr,"imagetotif: CMYK images shall be composed of at least 4 planes.\n");
      fprintf(_stderr,"\tAborting\n");
      return 1;
    }
    tif._0_4_ = 5;
    if (4 < (uint)rowStride) {
      rowStride._0_4_ = 4;
    }
  }
  else if ((uint)rowStride < 3) {
    tif._0_4_ = 1;
  }
  else {
    tif._0_4_ = 2;
    if (4 < (uint)rowStride) {
      rowStride._0_4_ = 4;
    }
  }
  rowStride._4_4_ = 1;
  while ((((rowStride._4_4_ < (uint)rowStride &&
           (image->comps->dx == image->comps[rowStride._4_4_].dx)) &&
          (image->comps->dy == image->comps[rowStride._4_4_].dy)) &&
         ((image->comps->prec == image->comps[rowStride._4_4_].prec &&
          (image->comps->sgnd == image->comps[rowStride._4_4_].sgnd))))) {
    planes[(ulong)rowStride._4_4_ - 1] = image->comps[rowStride._4_4_].data;
    rowStride._4_4_ = rowStride._4_4_ + 1;
  }
  if (rowStride._4_4_ == (uint)rowStride) {
    if (0x10 < sgnd) {
      sgnd = 0;
    }
    if (sgnd == 0) {
      fprintf(_stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",0);
      fprintf(_stderr,"\tAborting\n");
      image_local._4_4_ = 1;
    }
    else {
      lVar4 = TIFFOpen(outfile,"wb");
      if (lVar4 == 0) {
        fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
        image_local._4_4_ = 1;
      }
      else {
        for (rowStride._4_4_ = 0; rowStride._4_4_ < (uint)rowStride;
            rowStride._4_4_ = rowStride._4_4_ + 1) {
          clip_component(image->comps + rowStride._4_4_,image->comps->prec);
        }
        p_Var3 = convert_32s_PXCX_LUT[(uint)rowStride];
        switch(sgnd) {
        case 1:
        case 2:
        case 4:
        case 6:
        case 8:
          local_98 = convert_32sXXu_C1R_LUT[sgnd];
          break;
        case 3:
          local_98 = tif_32sto3u;
          break;
        case 5:
          local_98 = tif_32sto5u;
          break;
        case 7:
          local_98 = tif_32sto7u;
          break;
        case 9:
          local_98 = tif_32sto9u;
          break;
        case 10:
          local_98 = tif_32sto10u;
          break;
        case 0xb:
          local_98 = tif_32sto11u;
          break;
        case 0xc:
          local_98 = tif_32sto12u;
          break;
        case 0xd:
          local_98 = tif_32sto13u;
          break;
        case 0xe:
          local_98 = tif_32sto14u;
          break;
        case 0xf:
          local_98 = tif_32sto15u;
          break;
        case 0x10:
          local_98 = tif_32sto16u;
        }
        if (image->comps->sgnd == 0) {
          local_a4 = 0;
        }
        else {
          local_a4 = 1 << ((char)image->comps->prec - 1U & 0x1f);
        }
        OVar1 = image->comps->w;
        OVar2 = image->comps->h;
        TIFFSetField(lVar4,0x100,OVar1);
        TIFFSetField(lVar4,0x101,OVar2);
        TIFFSetField(lVar4,0x115,(uint)rowStride);
        TIFFSetField(lVar4,0x102,sgnd);
        TIFFSetField(lVar4,0x112,1);
        TIFFSetField(lVar4,0x11c,1);
        TIFFSetField(lVar4,0x106,tif._0_4_);
        TIFFSetField(lVar4,0x116,1);
        uVar5 = TIFFStripSize(lVar4);
        if ((long)(int)OVar1 * (ulong)(uint)rowStride * (long)sgnd + 7 >> 3 == uVar5) {
          pOVar6 = (OPJ_BYTE *)_TIFFmalloc(uVar5);
          if (pOVar6 == (OPJ_BYTE *)0x0) {
            TIFFClose(lVar4);
            image_local._4_4_ = 1;
          }
          else {
            planes[3] = (OPJ_INT32 *)malloc((long)(int)OVar1 * (ulong)(uint)rowStride * 4);
            if (planes[3] == (OPJ_INT32 *)0x0) {
              _TIFFfree(pOVar6);
              TIFFClose(lVar4);
              image_local._4_4_ = 1;
            }
            else {
              for (rowStride._4_4_ = 0; rowStride._4_4_ < image->comps->h;
                  rowStride._4_4_ = rowStride._4_4_ + 1) {
                (*p_Var3)((OPJ_INT32 **)&cvtPxToCx,planes[3],(long)(int)OVar1,local_a4);
                (*local_98)(planes[3],pOVar6,(long)(int)OVar1 * (ulong)(uint)rowStride);
                TIFFWriteEncodedStrip(lVar4,rowStride._4_4_,pOVar6,uVar5);
                cvtPxToCx = cvtPxToCx + (long)(int)OVar1 * 4;
                planes[0] = planes[0] + (int)OVar1;
                planes[1] = planes[1] + (int)OVar1;
                planes[2] = planes[2] + (int)OVar1;
              }
              _TIFFfree(pOVar6);
              TIFFClose(lVar4);
              free(planes[3]);
              image_local._4_4_ = 0;
            }
          }
        }
        else {
          fprintf(_stderr,"Invalid TIFF strip size\n");
          TIFFClose(lVar4);
          image_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"imagetotif: All components shall have the same subsampling, same bit depth.\n")
    ;
    fprintf(_stderr,"\tAborting\n");
    image_local._4_4_ = 1;
  }
  return image_local._4_4_;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
	int width, height;
	int bps,adjust, sgnd;
	int tiPhoto;
	TIFF *tif;
	tdata_t buf;
	tsize_t strip_size;
	OPJ_UINT32 i, numcomps;
	OPJ_SIZE_T rowStride;
	OPJ_INT32* buffer32s = NULL;
	OPJ_INT32 const* planes[4];
	convert_32s_PXCX cvtPxToCx = NULL;
	convert_32sXXx_C1R cvt32sToTif = NULL;

	bps = (int)image->comps[0].prec;
	planes[0] = image->comps[0].data;
	
	numcomps = image->numcomps;
	
	if (image->color_space == OPJ_CLRSPC_CMYK) {
		if (numcomps < 4U) {
			fprintf(stderr,"imagetotif: CMYK images shall be composed of at least 4 planes.\n");
			fprintf(stderr,"\tAborting\n");
			return 1;
		}
		tiPhoto = PHOTOMETRIC_SEPARATED;
		if (numcomps > 4U) {
			numcomps = 4U; /* Alpha not supported */
		}
	}
	else if (numcomps > 2U) {
		tiPhoto = PHOTOMETRIC_RGB;
		if (numcomps > 4U) {
			numcomps = 4U;
		}
	} else {
		tiPhoto = PHOTOMETRIC_MINISBLACK;
	}
	for (i = 1U; i < numcomps; ++i) {
		if (image->comps[0].dx != image->comps[i].dx) {
			break;
		}
		if (image->comps[0].dy != image->comps[i].dy) {
			break;
		}
		if (image->comps[0].prec != image->comps[i].prec) {
			break;
		}
		if (image->comps[0].sgnd != image->comps[i].sgnd) {
			break;
		}
		planes[i] = image->comps[i].data;
	}
	if (i != numcomps) {
		fprintf(stderr,"imagetotif: All components shall have the same subsampling, same bit depth.\n");
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	
	if(bps > 16) bps = 0;
	if(bps == 0)
	{
		fprintf(stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",bps);
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	tif = TIFFOpen(outfile, "wb");
	if (!tif)
	{
		fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
		return 1;
	}
	for (i = 0U; i < numcomps; ++i) {
		clip_component(&(image->comps[i]), image->comps[0].prec);
	}
	cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
	switch (bps) {
		case 1:
		case 2:
		case 4:
		case 6:
		case 8:
			cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
			break;
		case 3:
			cvt32sToTif = tif_32sto3u;
			break;
		case 5:
			cvt32sToTif = tif_32sto5u;
			break;
		case 7:
			cvt32sToTif = tif_32sto7u;
			break;
		case 9:
			cvt32sToTif = tif_32sto9u;
			break;
		case 10:
			cvt32sToTif = tif_32sto10u;
			break;
		case 11:
			cvt32sToTif = tif_32sto11u;
			break;
		case 12:
			cvt32sToTif = tif_32sto12u;
			break;
		case 13:
			cvt32sToTif = tif_32sto13u;
			break;
		case 14:
			cvt32sToTif = tif_32sto14u;
			break;
		case 15:
			cvt32sToTif = tif_32sto15u;
			break;
		case 16:
			cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
			break;
		default:
			/* never here */
			break;
	}
	sgnd = (int)image->comps[0].sgnd;
	adjust = sgnd ? 1 << (image->comps[0].prec - 1) : 0;
	width   = (int)image->comps[0].w;
	height  = (int)image->comps[0].h;
	
	TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
	TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
	TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, numcomps);
	TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
	TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
	TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
	TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
	TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
	
	strip_size = TIFFStripSize(tif);
	rowStride = ((OPJ_SIZE_T)width * numcomps * (OPJ_SIZE_T)bps + 7U) / 8U;
	if (rowStride != (OPJ_SIZE_T)strip_size) {
		fprintf(stderr, "Invalid TIFF strip size\n");
		TIFFClose(tif);
		return 1;
	}
	buf = _TIFFmalloc(strip_size);
	if (buf == NULL) {
		TIFFClose(tif);
		return 1;
	}
	buffer32s = (OPJ_INT32 *)malloc((OPJ_SIZE_T)width * numcomps * sizeof(OPJ_INT32));
	if (buffer32s == NULL) {
		_TIFFfree(buf);
		TIFFClose(tif);
		return 1;
	}
	
	for (i = 0; i < image->comps[0].h; ++i) {
		cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
		cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
		(void)TIFFWriteEncodedStrip(tif, i, (void*)buf, strip_size);
		planes[0] += width;
		planes[1] += width;
		planes[2] += width;
		planes[3] += width;
	}
	_TIFFfree((void*)buf);
	TIFFClose(tif);
	free(buffer32s);
		
	return 0;
}